

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int withExpand(Walker *pWalker,SrcList_item *pFrom)

{
  int *piVar1;
  LookasideSlot *pLVar2;
  Select *p;
  int iVar3;
  undefined8 *puVar4;
  char *pcVar5;
  Select *pSVar6;
  long lVar7;
  bool bVar8;
  Select *pPrior;
  SrcList_item *pItem;
  SrcList *pSrc;
  int i;
  With *pSavedWith;
  Select *pSStack_60;
  int bMayRecursive;
  Select *pLeft;
  Select *pSel;
  ExprList *pEList;
  Table *pTab;
  With *pWith;
  Cte *pCte;
  sqlite3 *db;
  Parse *pParse;
  SrcList_item *pFrom_local;
  Walker *pWalker_local;
  
  db = (sqlite3 *)pWalker->pParse;
  pCte = (Cte *)db->pVfs;
  pParse = (Parse *)pFrom;
  pFrom_local = (SrcList_item *)pWalker;
  pWith = (With *)searchWith((With *)(db->lookaside).pFree,pFrom,(With **)&pTab);
  if (pWith != (With *)0x0) {
    if (pWith->a[0].pCols != (ExprList *)0x0) {
      sqlite3ErrorMsg((Parse *)db,(char *)pWith->a[0].pCols,*(undefined8 *)pWith);
      return 1;
    }
    iVar3 = cannotBeFunction((Parse *)db,(SrcList_item *)pParse);
    if (iVar3 != 0) {
      return 1;
    }
    puVar4 = (undefined8 *)sqlite3DbMallocZero((sqlite3 *)pCte,0x80);
    *(undefined8 **)&pParse->isMultiWrite = puVar4;
    if (puVar4 == (undefined8 *)0x0) {
      return 2;
    }
    *(undefined4 *)((long)puVar4 + 0x3c) = 1;
    pcVar5 = sqlite3DbStrDup((sqlite3 *)pCte,*(char **)pWith);
    *puVar4 = pcVar5;
    *(undefined2 *)((long)puVar4 + 0x44) = 0xffff;
    *(undefined2 *)(puVar4 + 9) = 200;
    *(uint *)(puVar4 + 8) = *(uint *)(puVar4 + 8) | 0x42;
    pSVar6 = sqlite3SelectDup((sqlite3 *)pCte,(Select *)pWith->a[0].zName,0);
    *(Select **)&pParse->nRangeReg = pSVar6;
    if (*(char *)((long)&pCte[3].zName + 1) != '\0') {
      return 7;
    }
    pSVar6 = *(Select **)&pParse->nRangeReg;
    bVar8 = true;
    if (pSVar6->op != 0x80) {
      bVar8 = pSVar6->op == '\x7f';
    }
    if (bVar8) {
      piVar1 = *(int **)(*(long *)&pParse->nRangeReg + 0x28);
      for (pSrc._4_4_ = 0; pSrc._4_4_ < *piVar1; pSrc._4_4_ = pSrc._4_4_ + 1) {
        lVar7 = (long)pSrc._4_4_;
        if (((*(long *)(piVar1 + lVar7 * 0x1c + 4) == 0) &&
            (*(long *)(piVar1 + lVar7 * 0x1c + 6) != 0)) &&
           (iVar3 = sqlite3StrICmp(*(char **)(piVar1 + lVar7 * 0x1c + 6),*(char **)pWith),
           iVar3 == 0)) {
          *(undefined8 **)(piVar1 + lVar7 * 0x1c + 10) = puVar4;
          *(byte *)((long)piVar1 + lVar7 * 0x70 + 0x45) =
               *(byte *)((long)piVar1 + lVar7 * 0x70 + 0x45) & 0xdf | 0x20;
          *(int *)((long)puVar4 + 0x3c) = *(int *)((long)puVar4 + 0x3c) + 1;
          pSVar6->selFlags = pSVar6->selFlags | 0x2000;
        }
      }
    }
    if (2 < *(uint *)((long)puVar4 + 0x3c)) {
      sqlite3ErrorMsg((Parse *)db,"multiple references to recursive table: %s",*(undefined8 *)pWith)
      ;
      return 1;
    }
    pWith->a[0].pCols = (ExprList *)"circular reference: %s";
    pLVar2 = (db->lookaside).pFree;
    (db->lookaside).pFree = (LookasideSlot *)pTab;
    if (bVar8) {
      p = pSVar6->pPrior;
      p->pWith = pSVar6->pWith;
      sqlite3WalkSelect((Walker *)pFrom_local,p);
      p->pWith = (With *)0x0;
    }
    else {
      sqlite3WalkSelect((Walker *)pFrom_local,pSVar6);
    }
    (db->lookaside).pFree = (LookasideSlot *)pTab;
    for (pSStack_60 = pSVar6; pSStack_60->pPrior != (Select *)0x0; pSStack_60 = pSStack_60->pPrior)
    {
    }
    pSel = (Select *)pSStack_60->pEList;
    if (pWith->pOuter != (With *)0x0) {
      if ((pSel != (Select *)0x0) && (*(int *)&pSel->pEList != pWith->pOuter->nCte)) {
        sqlite3ErrorMsg((Parse *)db,"table %s has %d values for %d columns",*(undefined8 *)pWith,
                        (ulong)*(uint *)&pSel->pEList,(ulong)(uint)pWith->pOuter->nCte);
        (db->lookaside).pFree = pLVar2;
        return 1;
      }
      pSel = (Select *)pWith->pOuter;
    }
    sqlite3ColumnsFromExprList
              ((Parse *)db,(ExprList *)pSel,(i16 *)((long)puVar4 + 0x46),(Column **)(puVar4 + 1));
    if (bVar8) {
      if ((pSVar6->selFlags & 0x2000) == 0) {
        pWith->a[0].pCols = (ExprList *)"recursive reference in a subquery: %s";
      }
      else {
        pWith->a[0].pCols = (ExprList *)"multiple recursive references: %s";
      }
      sqlite3WalkSelect((Walker *)pFrom_local,pSVar6);
    }
    pWith->a[0].pCols = (ExprList *)0x0;
    (db->lookaside).pFree = pLVar2;
  }
  return 0;
}

Assistant:

static int withExpand(
  Walker *pWalker, 
  struct SrcList_item *pFrom
){
  Parse *pParse = pWalker->pParse;
  sqlite3 *db = pParse->db;
  struct Cte *pCte;               /* Matched CTE (or NULL if no match) */
  With *pWith;                    /* WITH clause that pCte belongs to */

  assert( pFrom->pTab==0 );

  pCte = searchWith(pParse->pWith, pFrom, &pWith);
  if( pCte ){
    Table *pTab;
    ExprList *pEList;
    Select *pSel;
    Select *pLeft;                /* Left-most SELECT statement */
    int bMayRecursive;            /* True if compound joined by UNION [ALL] */
    With *pSavedWith;             /* Initial value of pParse->pWith */

    /* If pCte->zCteErr is non-NULL at this point, then this is an illegal
    ** recursive reference to CTE pCte. Leave an error in pParse and return
    ** early. If pCte->zCteErr is NULL, then this is not a recursive reference.
    ** In this case, proceed.  */
    if( pCte->zCteErr ){
      sqlite3ErrorMsg(pParse, pCte->zCteErr, pCte->zName);
      return SQLITE_ERROR;
    }
    if( cannotBeFunction(pParse, pFrom) ) return SQLITE_ERROR;

    assert( pFrom->pTab==0 );
    pFrom->pTab = pTab = sqlite3DbMallocZero(db, sizeof(Table));
    if( pTab==0 ) return WRC_Abort;
    pTab->nTabRef = 1;
    pTab->zName = sqlite3DbStrDup(db, pCte->zName);
    pTab->iPKey = -1;
    pTab->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
    pTab->tabFlags |= TF_Ephemeral | TF_NoVisibleRowid;
    pFrom->pSelect = sqlite3SelectDup(db, pCte->pSelect, 0);
    if( db->mallocFailed ) return SQLITE_NOMEM_BKPT;
    assert( pFrom->pSelect );

    /* Check if this is a recursive CTE. */
    pSel = pFrom->pSelect;
    bMayRecursive = ( pSel->op==TK_ALL || pSel->op==TK_UNION );
    if( bMayRecursive ){
      int i;
      SrcList *pSrc = pFrom->pSelect->pSrc;
      for(i=0; i<pSrc->nSrc; i++){
        struct SrcList_item *pItem = &pSrc->a[i];
        if( pItem->zDatabase==0 
         && pItem->zName!=0 
         && 0==sqlite3StrICmp(pItem->zName, pCte->zName)
          ){
          pItem->pTab = pTab;
          pItem->fg.isRecursive = 1;
          pTab->nTabRef++;
          pSel->selFlags |= SF_Recursive;
        }
      }
    }

    /* Only one recursive reference is permitted. */ 
    if( pTab->nTabRef>2 ){
      sqlite3ErrorMsg(
          pParse, "multiple references to recursive table: %s", pCte->zName
      );
      return SQLITE_ERROR;
    }
    assert( pTab->nTabRef==1 || 
            ((pSel->selFlags&SF_Recursive) && pTab->nTabRef==2 ));

    pCte->zCteErr = "circular reference: %s";
    pSavedWith = pParse->pWith;
    pParse->pWith = pWith;
    if( bMayRecursive ){
      Select *pPrior = pSel->pPrior;
      assert( pPrior->pWith==0 );
      pPrior->pWith = pSel->pWith;
      sqlite3WalkSelect(pWalker, pPrior);
      pPrior->pWith = 0;
    }else{
      sqlite3WalkSelect(pWalker, pSel);
    }
    pParse->pWith = pWith;

    for(pLeft=pSel; pLeft->pPrior; pLeft=pLeft->pPrior);
    pEList = pLeft->pEList;
    if( pCte->pCols ){
      if( pEList && pEList->nExpr!=pCte->pCols->nExpr ){
        sqlite3ErrorMsg(pParse, "table %s has %d values for %d columns",
            pCte->zName, pEList->nExpr, pCte->pCols->nExpr
        );
        pParse->pWith = pSavedWith;
        return SQLITE_ERROR;
      }
      pEList = pCte->pCols;
    }

    sqlite3ColumnsFromExprList(pParse, pEList, &pTab->nCol, &pTab->aCol);
    if( bMayRecursive ){
      if( pSel->selFlags & SF_Recursive ){
        pCte->zCteErr = "multiple recursive references: %s";
      }else{
        pCte->zCteErr = "recursive reference in a subquery: %s";
      }
      sqlite3WalkSelect(pWalker, pSel);
    }
    pCte->zCteErr = 0;
    pParse->pWith = pSavedWith;
  }

  return SQLITE_OK;
}